

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcEncrypt.c
# Opt level: O2

void encryptInPlace(ThreefishKey_t *key,uint64_t *chain,uint64_t *plain_text,uint64_t num_blocks)

{
  u64b_t uVar1;
  ulong uVar2;
  
  uVar1 = key->stateSize;
  if (uVar1 == 0x400) {
    *plain_text = *plain_text ^ *chain;
    plain_text[1] = plain_text[1] ^ chain[1];
    plain_text[2] = plain_text[2] ^ chain[2];
    plain_text[3] = plain_text[3] ^ chain[3];
    plain_text[4] = plain_text[4] ^ chain[4];
    plain_text[5] = plain_text[5] ^ chain[5];
    plain_text[6] = plain_text[6] ^ chain[6];
    plain_text[7] = plain_text[7] ^ chain[7];
    plain_text[8] = plain_text[8] ^ chain[8];
    plain_text[9] = plain_text[9] ^ chain[9];
    plain_text[10] = plain_text[10] ^ chain[10];
    plain_text[0xb] = plain_text[0xb] ^ chain[0xb];
    plain_text[0xc] = plain_text[0xc] ^ chain[0xc];
    plain_text[0xd] = plain_text[0xd] ^ chain[0xd];
    plain_text[0xe] = plain_text[0xe] ^ chain[0xe];
    plain_text[0xf] = plain_text[0xf] ^ chain[0xf];
    for (uVar2 = 0; uVar2 < num_blocks << 4; uVar2 = uVar2 + 0x10) {
      if (uVar2 != 0) {
        *(uint *)plain_text = (uint)plain_text[-0x10] ^ (uint)*plain_text;
        *(uint *)((long)plain_text + 4) =
             *(uint *)((long)plain_text + -0x7c) ^ *(uint *)((long)plain_text + 4);
        *(uint *)(plain_text + 1) = (uint)plain_text[-0xf] ^ (uint)plain_text[1];
        *(uint *)((long)plain_text + 0xc) =
             *(uint *)((long)plain_text + -0x74) ^ *(uint *)((long)plain_text + 0xc);
        *(uint *)(plain_text + 2) = (uint)plain_text[2] ^ (uint)plain_text[-0xe];
        *(uint *)((long)plain_text + 0x14) =
             *(uint *)((long)plain_text + 0x14) ^ *(uint *)((long)plain_text + -0x6c);
        *(uint *)(plain_text + 3) = (uint)plain_text[3] ^ (uint)plain_text[-0xd];
        *(uint *)((long)plain_text + 0x1c) =
             *(uint *)((long)plain_text + 0x1c) ^ *(uint *)((long)plain_text + -100);
        *(uint *)(plain_text + 4) = (uint)plain_text[4] ^ (uint)plain_text[-0xc];
        *(uint *)((long)plain_text + 0x24) =
             *(uint *)((long)plain_text + 0x24) ^ *(uint *)((long)plain_text + -0x5c);
        *(uint *)(plain_text + 5) = (uint)plain_text[5] ^ (uint)plain_text[-0xb];
        *(uint *)((long)plain_text + 0x2c) =
             *(uint *)((long)plain_text + 0x2c) ^ *(uint *)((long)plain_text + -0x54);
        *(uint *)(plain_text + 6) = (uint)plain_text[6] ^ (uint)plain_text[-10];
        *(uint *)((long)plain_text + 0x34) =
             *(uint *)((long)plain_text + 0x34) ^ *(uint *)((long)plain_text + -0x4c);
        *(uint *)(plain_text + 7) = (uint)plain_text[7] ^ (uint)plain_text[-9];
        *(uint *)((long)plain_text + 0x3c) =
             *(uint *)((long)plain_text + 0x3c) ^ *(uint *)((long)plain_text + -0x44);
        *(uint *)(plain_text + 8) = (uint)plain_text[8] ^ (uint)plain_text[-8];
        *(uint *)((long)plain_text + 0x44) =
             *(uint *)((long)plain_text + 0x44) ^ *(uint *)((long)plain_text + -0x3c);
        *(uint *)(plain_text + 9) = (uint)plain_text[9] ^ (uint)plain_text[-7];
        *(uint *)((long)plain_text + 0x4c) =
             *(uint *)((long)plain_text + 0x4c) ^ *(uint *)((long)plain_text + -0x34);
        *(uint *)(plain_text + 10) = (uint)plain_text[10] ^ (uint)plain_text[-6];
        *(uint *)((long)plain_text + 0x54) =
             *(uint *)((long)plain_text + 0x54) ^ *(uint *)((long)plain_text + -0x2c);
        *(uint *)(plain_text + 0xb) = (uint)plain_text[0xb] ^ (uint)plain_text[-5];
        *(uint *)((long)plain_text + 0x5c) =
             *(uint *)((long)plain_text + 0x5c) ^ *(uint *)((long)plain_text + -0x24);
        *(uint *)(plain_text + 0xc) = (uint)plain_text[0xc] ^ (uint)plain_text[-4];
        *(uint *)((long)plain_text + 100) =
             *(uint *)((long)plain_text + 100) ^ *(uint *)((long)plain_text + -0x1c);
        *(uint *)(plain_text + 0xd) = (uint)plain_text[0xd] ^ (uint)plain_text[-3];
        *(uint *)((long)plain_text + 0x6c) =
             *(uint *)((long)plain_text + 0x6c) ^ *(uint *)((long)plain_text + -0x14);
        *(uint *)(plain_text + 0xe) = (uint)plain_text[0xe] ^ (uint)plain_text[-2];
        *(uint *)((long)plain_text + 0x74) =
             *(uint *)((long)plain_text + 0x74) ^ *(uint *)((long)plain_text + -0xc);
        *(uint *)(plain_text + 0xf) = (uint)plain_text[0xf] ^ (uint)plain_text[-1];
        *(uint *)((long)plain_text + 0x7c) =
             *(uint *)((long)plain_text + 0x7c) ^ *(uint *)((long)plain_text + -4);
      }
      threefishEncryptBlockWords(key,plain_text,plain_text);
      plain_text = plain_text + 0x10;
    }
    return;
  }
  if (uVar1 != 0x200) {
    if (uVar1 == 0x100) {
      cbc256Encrypt(key,chain,plain_text,num_blocks);
      return;
    }
    perror("Invalid state size cannot continue\n");
    exit(9);
  }
  *plain_text = *plain_text ^ *chain;
  plain_text[1] = plain_text[1] ^ chain[1];
  plain_text[2] = plain_text[2] ^ chain[2];
  plain_text[3] = plain_text[3] ^ chain[3];
  plain_text[4] = plain_text[4] ^ chain[4];
  plain_text[5] = plain_text[5] ^ chain[5];
  plain_text[6] = plain_text[6] ^ chain[6];
  plain_text[7] = plain_text[7] ^ chain[7];
  for (uVar2 = 0; uVar2 < num_blocks << 3; uVar2 = uVar2 + 8) {
    if (uVar2 != 0) {
      *(uint *)plain_text = (uint)plain_text[-8] ^ (uint)*plain_text;
      *(uint *)((long)plain_text + 4) =
           *(uint *)((long)plain_text + -0x3c) ^ *(uint *)((long)plain_text + 4);
      *(uint *)(plain_text + 1) = (uint)plain_text[-7] ^ (uint)plain_text[1];
      *(uint *)((long)plain_text + 0xc) =
           *(uint *)((long)plain_text + -0x34) ^ *(uint *)((long)plain_text + 0xc);
      *(uint *)(plain_text + 2) = (uint)plain_text[2] ^ (uint)plain_text[-6];
      *(uint *)((long)plain_text + 0x14) =
           *(uint *)((long)plain_text + 0x14) ^ *(uint *)((long)plain_text + -0x2c);
      *(uint *)(plain_text + 3) = (uint)plain_text[3] ^ (uint)plain_text[-5];
      *(uint *)((long)plain_text + 0x1c) =
           *(uint *)((long)plain_text + 0x1c) ^ *(uint *)((long)plain_text + -0x24);
      *(uint *)(plain_text + 4) = (uint)plain_text[4] ^ (uint)plain_text[-4];
      *(uint *)((long)plain_text + 0x24) =
           *(uint *)((long)plain_text + 0x24) ^ *(uint *)((long)plain_text + -0x1c);
      *(uint *)(plain_text + 5) = (uint)plain_text[5] ^ (uint)plain_text[-3];
      *(uint *)((long)plain_text + 0x2c) =
           *(uint *)((long)plain_text + 0x2c) ^ *(uint *)((long)plain_text + -0x14);
      *(uint *)(plain_text + 6) = (uint)plain_text[6] ^ (uint)plain_text[-2];
      *(uint *)((long)plain_text + 0x34) =
           *(uint *)((long)plain_text + 0x34) ^ *(uint *)((long)plain_text + -0xc);
      *(uint *)(plain_text + 7) = (uint)plain_text[7] ^ (uint)plain_text[-1];
      *(uint *)((long)plain_text + 0x3c) =
           *(uint *)((long)plain_text + 0x3c) ^ *(uint *)((long)plain_text + -4);
    }
    threefishEncryptBlockWords(key,plain_text,plain_text);
    plain_text = plain_text + 8;
  }
  return;
}

Assistant:

void encryptInPlace(ThreefishKey_t* key,
                    const uint64_t* chain,
                    uint64_t* plain_text,
                    const uint64_t num_blocks)
{
    pd2("encryptInPlace(key:%lu, chain:%lu, plain_text:%lu, num_blocks:%lu)\n",
        key->key[0],
        chain[0],
        plain_text[0],
        num_blocks);

    switch(key->stateSize) //call the corresponding cbc Encrypt function
    {
        case 256: cbc256Encrypt(key, chain, plain_text, num_blocks);
        break;
        case 512: cbc512Encrypt(key, chain, plain_text, num_blocks);
        break;
        case 1024: cbc1024Encrypt(key, chain, plain_text, num_blocks);
        break;
        default:
        {
            perror("Invalid state size cannot continue\n");
            exit(9);
        }
        break;
    }
}